

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::SRGBTestCase::logColor
          (SRGBTestCase *this,string *colorLogMessage,int colorIdx,Vec4 *color)

{
  TestContext *this_00;
  ostream *poVar1;
  float *pfVar2;
  MessageBuilder *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  MessageBuilder local_338;
  ostringstream local_1a8 [8];
  ostringstream message;
  TestLog *log;
  Vec4 *color_local;
  int colorIdx_local;
  string *colorLogMessage_local;
  SRGBTestCase *this_local;
  
  this_00 = gles31::Context::getTestContext((this->super_TestCase).m_context);
  message._368_8_ = tcu::TestContext::getLog(this_00);
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  poVar1 = std::operator<<((ostream *)local_1a8,(string *)colorLogMessage);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,colorIdx);
  poVar1 = std::operator<<(poVar1," = (");
  pfVar2 = tcu::Vector<float,_4>::x(color);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pfVar2);
  poVar1 = std::operator<<(poVar1,", ");
  pfVar2 = tcu::Vector<float,_4>::y(color);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pfVar2);
  poVar1 = std::operator<<(poVar1,", ");
  pfVar2 = tcu::Vector<float,_4>::z(color);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pfVar2);
  poVar1 = std::operator<<(poVar1,", ");
  pfVar2 = tcu::Vector<float,_4>::w(color);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pfVar2);
  std::operator<<(poVar1,")");
  tcu::TestLog::operator<<
            (&local_338,(TestLog *)message._368_8_,(BeginMessageToken *)&tcu::TestLog::Message);
  std::__cxx11::ostringstream::str();
  this_01 = tcu::MessageBuilder::operator<<(&local_338,&local_358);
  tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)&local_358);
  tcu::MessageBuilder::~MessageBuilder(&local_338);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return;
}

Assistant:

void SRGBTestCase::logColor (const std::string& colorLogMessage, int colorIdx, tcu::Vec4 color) const
{
	tcu::TestLog&			log		= m_context.getTestContext().getLog();
	std::ostringstream		message;

	message << colorLogMessage << colorIdx << " = (" << color.x() << ", " << color.y() << ", " << color.z() << ", " << color.w() << ")";
	log << tcu::TestLog::Message << message.str() << tcu::TestLog::EndMessage;
}